

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neon_helper.c
# Opt level: O0

uint64_t helper_neon_qshl_s64_aarch64(CPUARMState_conflict *env,uint64_t valop,uint64_t shiftop)

{
  byte bVar1;
  ulong uVar2;
  int64_t tmp;
  int64_t val;
  int8_t shift;
  uint64_t shiftop_local;
  uint64_t valop_local;
  CPUARMState_conflict *env_local;
  
  bVar1 = (byte)shiftop;
  uVar2 = (long)valop >> 0x3f;
  if ((char)bVar1 < '@') {
    tmp = uVar2;
    if (-0x40 < (char)bVar1) {
      if ((char)bVar1 < '\0') {
        tmp = (long)valop >> (-bVar1 & 0x3f);
      }
      else {
        tmp = valop << (bVar1 & 0x3f);
        if (tmp >> (bVar1 & 0x3f) != valop) {
          (env->vfp).qc[0] = 1;
          tmp = uVar2 ^ 0x7fffffffffffffff;
        }
      }
    }
  }
  else {
    tmp = valop;
    if (valop != 0) {
      (env->vfp).qc[0] = 1;
      tmp = uVar2 ^ 0x7fffffffffffffff;
    }
  }
  return tmp;
}

Assistant:

uint64_t HELPER(neon_qshl_s64)(CPUARMState *env, uint64_t valop, uint64_t shiftop)
{
    int8_t shift = (uint8_t)shiftop;
    int64_t val = valop;
    if (shift >= 64) {
        if (val) {
            SET_QC();
            val = (val >> 63) ^ ~SIGNBIT64;
        }
    } else if (shift <= -64) {
        val >>= 63;
    } else if (shift < 0) {
        val >>= -shift;
    } else {
        int64_t tmp = val;
        val <<= shift;
        if ((val >> shift) != tmp) {
            SET_QC();
            val = (tmp >> 63) ^ ~SIGNBIT64;
        }
    }
    return val;
}